

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.hpp
# Opt level: O1

void __thiscall
tcmalloc::CentralFreelist::ReleaseToSpans(CentralFreelist *this,FreeList *freelist,int N)

{
  uint64_t *puVar1;
  undefined8 *puVar2;
  void ***pppvVar3;
  void **ppvVar4;
  Span *pSVar5;
  bool bVar6;
  uint64_t uVar7;
  PageHeap *pPVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  Span *span;
  
  uVar7 = freelist->free_count_;
  if (uVar7 != 0) {
    do {
      puVar2 = (undefined8 *)freelist->head_;
      freelist->head_ = (void *)*puVar2;
      freelist->free_count_ = uVar7 - 1;
      pPVar8 = PageHeap::Instance();
      pppvVar3 = (pPVar8->page_map_).roots[(ulong)puVar2 >> 0x37];
      if ((pppvVar3 == (void ***)0x0) ||
         (ppvVar4 = pppvVar3[(uint)((ulong)puVar2 >> 0x21) & 0x3fffff], ppvVar4 == (void **)0x0)) {
        span = (Span *)0x0;
      }
      else {
        span = (Span *)ppvVar4[(uint)((ulong)puVar2 >> 0xd) & 0xfffff];
      }
      if (span->location != 0) {
        __assert_fail("span->location == Span::IN_USE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/central_freelist.hpp"
                      ,0x77,"void tcmalloc::CentralFreelist::ReleaseToSpans(FreeList &, int)");
      }
      if (span->size_class != (long)this->class_) {
        __assert_fail("span->size_class == class_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/central_freelist.hpp"
                      ,0x78,"void tcmalloc::CentralFreelist::ReleaseToSpans(FreeList &, int)");
      }
      if ((span->freelist).free_count_ == 0) {
        this->span_nums_ = this->span_nums_ - 1;
        pSVar5 = span->prev;
        pSVar5->next = span->next;
        span->next->prev = pSVar5;
        span->prev = (Span *)0x0;
        span->next = (Span *)0x0;
        this->span_nums_ = this->span_nums_ + 1;
        span->prev = &this->nonempty_;
        pSVar5 = (this->nonempty_).next;
        span->next = pSVar5;
        pSVar5->prev = span;
        (this->nonempty_).next = span;
      }
      puVar1 = &span->refcount;
      *puVar1 = *puVar1 - 1;
      uVar7 = *puVar1;
      uVar9 = this->free_objects_ + 1;
      this->free_objects_ = uVar9;
      *puVar2 = (span->freelist).head_;
      uVar10 = (span->freelist).free_count_ + 1;
      (span->freelist).head_ = puVar2;
      (span->freelist).free_count_ = uVar10;
      if (uVar7 == 0) {
        this->free_objects_ = uVar9 - (long)(int)uVar10;
        this->span_nums_ = this->span_nums_ - 1;
        pSVar5 = span->prev;
        pSVar5->next = span->next;
        span->next->prev = pSVar5;
        span->prev = (Span *)0x0;
        span->next = (Span *)0x0;
        pPVar8 = PageHeap::Instance();
        PageHeap::Delete(pPVar8,span);
      }
      uVar7 = freelist->free_count_;
    } while (uVar7 != 0);
  }
  bVar6 = CheckState(this);
  if (bVar6) {
    return;
  }
  __assert_fail("CheckState()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jamsonzan[P]tcmalloc/example/../src/central_freelist.hpp"
                ,0x89,"void tcmalloc::CentralFreelist::ReleaseToSpans(FreeList &, int)");
}

Assistant:

void ReleaseToSpans(FreeList& freelist, int N) {
        while (!freelist.Empty()) {
            void* ptr = freelist.PopFront();
            Span* span = PageHeap::Instance()->GetSpanFromPageId(Span::PageIdFromPtr(ptr));
            assert(span->location == Span::IN_USE);
            assert(span->size_class == class_);

            if (span->freelist.Empty()) {
                RemoveFromList(span);
                InsertToList(&nonempty_, span);
            }

            span->refcount--;
            free_objects_++;
            span->freelist.PushFront(ptr);

            if (span->refcount == 0) {
                free_objects_ -= span->freelist.FreeObjects();
                RemoveFromList(span);
                PageHeap::Instance()->Delete(span);
            }
        }
        assert(CheckState());
    }